

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O3

el_action_t em_lower_case(EditLine *el,wint_t c)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  pwVar3 = c__next_word((el->el_line).cursor,(el->el_line).lastchar,(el->el_state).argument,
                        ce__isword);
  for (pwVar4 = (el->el_line).cursor; pwVar4 < pwVar3; pwVar4 = pwVar4 + 1) {
    iVar1 = iswupper(*pwVar4);
    if (iVar1 != 0) {
      wVar2 = towlower(*pwVar4);
      *pwVar4 = wVar2;
    }
  }
  pwVar4 = (el->el_line).lastchar;
  if (pwVar4 < pwVar3) {
    pwVar3 = pwVar4;
  }
  (el->el_line).cursor = pwVar3;
  return '\x04';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_lower_case(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *cp, *ep;

	ep = c__next_word(el->el_line.cursor, el->el_line.lastchar,
	    el->el_state.argument, ce__isword);

	for (cp = el->el_line.cursor; cp < ep; cp++)
		if (iswupper(*cp))
			*cp = towlower(*cp);

	el->el_line.cursor = ep;
	if (el->el_line.cursor > el->el_line.lastchar)
		el->el_line.cursor = el->el_line.lastchar;
	return CC_REFRESH;
}